

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O1

TestCaseGroup * vkt::synchronization::createBasicEventTests(TestContext *testCtx)

{
  TestContext *pTVar1;
  TestNode *this;
  TestNode *pTVar2;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,"event","Basic event tests");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"host_set_reset","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Basic event tests set and reset on host","");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_0::hostResetSetEventCase;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"device_set_reset","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Basic event tests set and reset on device","");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_0::deviceResetSetEventCase;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"host_set_device_wait","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Wait for event on device test","");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_0::deviceWaitForEventCase;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"single_submit_multi_command_buffer","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Wait and set event single submission on device","");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_0::singleSubmissionCase;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"multi_submit_multi_command_buffer","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Wait and set event mutli submission on device","");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_0::multiSubmissionCase;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"multi_secondary_command_buffer","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Event used on secondary command buffer ","");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_0::secondaryCommandBufferCase;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createBasicEventTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> basicTests(new tcu::TestCaseGroup(testCtx, "event", "Basic event tests"));
	addFunctionCase(basicTests.get(), "host_set_reset",   "Basic event tests set and reset on host", hostResetSetEventCase);
	addFunctionCase(basicTests.get(), "device_set_reset", "Basic event tests set and reset on device", deviceResetSetEventCase);
	addFunctionCase(basicTests.get(), "host_set_device_wait", "Wait for event on device test", deviceWaitForEventCase);
	addFunctionCase(basicTests.get(), "single_submit_multi_command_buffer", "Wait and set event single submission on device", singleSubmissionCase);
	addFunctionCase(basicTests.get(), "multi_submit_multi_command_buffer", "Wait and set event mutli submission on device", multiSubmissionCase);
	addFunctionCase(basicTests.get(), "multi_secondary_command_buffer", "Event used on secondary command buffer ", secondaryCommandBufferCase);

	return basicTests.release();
}